

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O1

void on_underlying_io_error(void *context)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  TLS_IO_INSTANCE *tls_io_instance;
  
  if (*(int *)((long)context + 0x68) - 1U < 2) {
    *(undefined4 *)((long)context + 0x68) = 0;
    indicate_open_complete((TLS_IO_INSTANCE *)context,IO_OPEN_ERROR);
    return;
  }
  if (*(int *)((long)context + 0x68) != 4) {
    return;
  }
  if (*(code **)((long)context + 0x20) != (code *)0x0) {
    (**(code **)((long)context + 0x20))(*(undefined8 *)((long)context + 0x40));
    return;
  }
  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/deps/c-utility/adapters/tlsio_openssl.c"
               ,"indicate_error",0x28f,1,"NULL on_io_error.");
    return;
  }
  return;
}

Assistant:

static void on_underlying_io_error(void* context)
{
    TLS_IO_INSTANCE* tls_io_instance = (TLS_IO_INSTANCE*)context;

    switch (tls_io_instance->tlsio_state)
    {
    default:
        break;

    case TLSIO_STATE_OPENING_UNDERLYING_IO:
    case TLSIO_STATE_IN_HANDSHAKE:
        tls_io_instance->tlsio_state = TLSIO_STATE_NOT_OPEN;
        indicate_open_complete(tls_io_instance, IO_OPEN_ERROR);
        break;

    case TLSIO_STATE_OPEN:
        indicate_error(tls_io_instance);
        break;
    }
}